

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O0

void __thiscall
MyProgress::beginiter(MyProgress *this,Graph *param_2,uint iter,uint maxiter,uint window)

{
  int __n;
  _Setw _Var1;
  ostream *poVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_R8D;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"i = ");
  __n = width(in_ECX);
  _Var1 = std::setw(__n);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ECX);
  poVar2 = std::operator<<(poVar2,"  n = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_R8D);
  std::operator<<(poVar2,"  ");
  return;
}

Assistant:

void beginiter(const Graph*, unsigned int iter, unsigned int maxiter, unsigned int window) const
  {
    std::cerr << "i = " << std::setw(width(maxiter)) << iter << "/" << maxiter << "  n = " << window << "  ";
  }